

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void Parser::eliHide(TreeNode *treeNode)

{
  iterator this;
  bool bVar1;
  reference piVar2;
  reference pvVar3;
  const_iterator local_30;
  int *local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  iterator it;
  TreeNode *treeNode_local;
  
  it._M_current = (int *)treeNode;
  local_18._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&treeNode->sons);
  while( true ) {
    local_20._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(it._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_18);
    pvVar3 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[](&resultTree,(long)*piVar2)
    ;
    this = it;
    if ((pvVar3->hide & 1U) == 0) {
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_18);
    }
    else {
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_30,
                 &local_18);
      local_28 = (int *)std::vector<int,_std::allocator<int>_>::erase(this._M_current,local_30);
      local_18._M_current = local_28;
    }
  }
  return;
}

Assistant:

void eliHide(TreeNode &treeNode){
        auto it = treeNode.sons.begin();
        while(it!=treeNode.sons.end()){
            if(resultTree[*it].hide){
                it = treeNode.sons.erase(it);
            }else{
                ++it;
            }
        }
    }